

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O1

void gpointer_setglist(t_gpointer *gp,_glist *glist,t_scalar *x)

{
  int *piVar1;
  _gstub *p_Var2;
  
  if (gp->gp_stub != (t_gstub *)0x0) {
    gstub_dis(gp->gp_stub);
  }
  p_Var2 = glist->gl_stub;
  gp->gp_stub = p_Var2;
  gp->gp_valid = glist->gl_valid;
  (gp->gp_un).gp_scalar = x;
  piVar1 = &p_Var2->gs_refcount;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void gpointer_setglist(t_gpointer *gp, t_glist *glist, t_scalar *x)
{
    t_gstub *gs;
    if ((gs = gp->gp_stub)) gstub_dis(gs);
    gp->gp_stub = gs = glist->gl_stub;
    gp->gp_valid = glist->gl_valid;
    gp->gp_un.gp_scalar = x;
    gs->gs_refcount++;
}